

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void * __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Indexing::TermWithoutValue>::Node_*,_Indexing::SubstitutionTree<Indexing::TermWithoutValue>::SListIntermediateNode::NodePtrComparator>
::insertPositionRaw<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Indexing::TermWithoutValue>::Node_*,_Indexing::SubstitutionTree<Indexing::TermWithoutValue>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  Node *pNVar2;
  bool bVar3;
  Comparison CVar4;
  Node *pNVar5;
  uint h;
  uint uVar6;
  ulong uVar7;
  Node *pNVar8;
  Top local_40;
  
  local_40._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_40._inner._inner._content[7] = key._inner._inner._content[7];
  h = 0xffffffff;
  do {
    bVar3 = Random::getBit();
    h = h + 1;
  } while (bVar3);
  uVar6 = this->_top;
  if (uVar6 <= h) {
    if (uVar6 < 0x20) {
      this->_top = uVar6 + 1;
      h = uVar6;
    }
    else {
      h = uVar6 - 1;
    }
  }
  pNVar5 = allocate(h);
  uVar7 = (ulong)this->_top;
  pNVar8 = this->_left;
LAB_0034b270:
  do {
    uVar6 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar6;
    pNVar2 = pNVar8;
    do {
      pNVar8 = pNVar2;
      pNVar1 = pNVar8->nodes[uVar7];
      if (pNVar1 == (Node *)0x0) {
        if (h < uVar6) goto LAB_0034b270;
        pNVar8->nodes[uVar7] = pNVar5;
        pNVar5->nodes[uVar7] = (Node *)0x0;
        goto LAB_0034b2bb;
      }
      CVar4 = Indexing::SubstitutionTree<Indexing::TermWithoutValue>::SListIntermediateNode::
              NodePtrComparator::compare(&local_40,pNVar1->value);
      pNVar2 = pNVar1;
    } while (((uint)CVar4 < 2) || (pNVar2 = pNVar8, CVar4 != LESS));
    if (uVar6 <= h) {
      pNVar5->nodes[uVar7] = pNVar1;
      pNVar8->nodes[uVar7] = pNVar5;
LAB_0034b2bb:
      if (uVar7 == 0) {
        return pNVar5;
      }
    }
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }